

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_avl.c
# Opt level: O3

void add_elements(tree_element *elements,_Bool do_random)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  tree_element *ptVar4;
  long lVar5;
  _Bool added [6];
  char local_30 [8];
  
  if ((int)elements == 0) {
    ptVar4 = nodes;
    lVar5 = 6;
    do {
      (ptVar4->node).key = ptVar4;
      avl_insert(&head,&ptVar4->node);
      ptVar4 = ptVar4 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  else {
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[0] = '\0';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    iVar2 = 0;
    do {
      iVar1 = rand();
      uVar3 = (ulong)(uint)(iVar1 % 6);
      if (local_30[uVar3] == '\x01') {
        do {
          uVar3 = (ulong)(((int)uVar3 + 1U) % 6);
        } while (local_30[uVar3] != '\0');
      }
      nodes[uVar3].node.key = nodes + uVar3;
      avl_insert(&head);
      local_30[uVar3] = '\x01';
      iVar2 = iVar2 + 1;
    } while (iVar2 != 6);
  }
  return;
}

Assistant:

static void add_elements(struct tree_element *elements, bool do_random) {
  uint32_t i;
  bool added[COUNT];

  if (do_random) {
    for (i=0; i<COUNT; i++) {
      added[i] = false;
    }

    for (i=0; i<COUNT; i++) {
      uint32_t num = rand() % COUNT;

      while (added[num]) {
        num = (num + 1) % COUNT;
      }

      elements[num].node.key = &elements[num].value;
      avl_insert(&head, &elements[num].node);
      added[num] = true;
    }
  }
  else {
    for (i=0; i<COUNT; i++) {
      elements[i].node.key = &elements[i].value;
      avl_insert(&head, &elements[i].node);
    }
  }
}